

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O0

void __thiscall FFont::LoadTranslations(FFont *this)

{
  FFontChar1 *this_00;
  double *luminosity_00;
  uint uVar1;
  int iVar2;
  TranslationParm *ranges;
  uint local_234;
  uint i_1;
  FFontChar1 *pic;
  double *pdStack_220;
  uint i;
  double *luminosity;
  BYTE identity [256];
  BYTE usedcolors [256];
  uint count;
  FFont *this_local;
  
  uVar1 = (this->LastChar - this->FirstChar) + 1;
  memset(identity + 0xf8,0,0x100);
  for (pic._4_4_ = 0; pic._4_4_ < uVar1; pic._4_4_ = pic._4_4_ + 1) {
    this_00 = (FFontChar1 *)this->Chars[pic._4_4_].Pic;
    if (this_00 != (FFontChar1 *)0x0) {
      FFontChar1::SetSourceRemap(this_00,(BYTE *)0x0);
      RecordTextureColors((FTexture *)this_00,identity + 0xf8);
    }
  }
  iVar2 = SimpleTranslation(identity + 0xf8,this->PatchRemap,(BYTE *)&luminosity,
                            &stack0xfffffffffffffde0);
  this->ActiveColors = iVar2;
  for (local_234 = 0; luminosity_00 = pdStack_220, local_234 < uVar1; local_234 = local_234 + 1) {
    if (this->Chars[local_234].Pic != (FTexture *)0x0) {
      FFontChar1::SetSourceRemap((FFontChar1 *)this->Chars[local_234].Pic,this->PatchRemap);
    }
  }
  ranges = TArray<TranslationParm,_TranslationParm>::operator[](TranslationParms,0);
  BuildTranslations(this,luminosity_00,(BYTE *)&luminosity,ranges,this->ActiveColors,(PalEntry *)0x0
                   );
  if (pdStack_220 != (double *)0x0) {
    operator_delete__(pdStack_220);
  }
  return;
}

Assistant:

void FFont::LoadTranslations()
{
	unsigned int count = LastChar - FirstChar + 1;
	BYTE usedcolors[256], identity[256];
	double *luminosity;

	memset (usedcolors, 0, 256);
	for (unsigned int i = 0; i < count; i++)
	{
		FFontChar1 *pic = static_cast<FFontChar1 *>(Chars[i].Pic);
		if(pic)
		{
			pic->SetSourceRemap(NULL); // Force the FFontChar1 to return the same pixels as the base texture
			RecordTextureColors (pic, usedcolors);
		}
	}

	ActiveColors = SimpleTranslation (usedcolors, PatchRemap, identity, &luminosity);

	for (unsigned int i = 0; i < count; i++)
	{
		if(Chars[i].Pic)
			static_cast<FFontChar1 *>(Chars[i].Pic)->SetSourceRemap(PatchRemap);
	}

	BuildTranslations (luminosity, identity, &TranslationParms[0][0], ActiveColors, NULL);

	delete[] luminosity;
}